

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InfoLogCase::iterate(InfoLogCase *this)

{
  RenderContext *pRVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  ProgramSources *pPVar6;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_30d;
  int written;
  StateQueryMemoryWriteGuard<int> logLen;
  string buf;
  ScopedLogSection section;
  GLuint local_2b8;
  CallLogWrapper gl;
  ScopedLogSection section_2;
  ResultCollector result;
  ShaderProgram frgProgram;
  ShaderProgram vtxProgram;
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&frgProgram,0,0xac);
  frgProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  frgProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  frgProgram.m_program.m_info.linkOk = false;
  frgProgram.m_program.m_info._33_7_ = 0;
  frgProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,
             "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&logLen);
  glu::VertexSource::VertexSource((VertexSource *)&result,&buf);
  pPVar6 = glu::ProgramSources::operator<<((ProgramSources *)&frgProgram,(ShaderSource *)&result);
  glu::ShaderProgram::ShaderProgram(&vtxProgram,pRVar1,pPVar6);
  std::__cxx11::string::~string((string *)&result.m_prefix);
  std::__cxx11::string::~string((string *)&buf);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&frgProgram);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&result,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLen,
             "#version 310 es\nin mediump vec2 v_colorB;\nin mediump vec2 v_colorC;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_colorB.xxyy + v_colorC.yyxy;\n}\n"
             ,(allocator<char> *)&gl);
  glu::FragmentSource::FragmentSource((FragmentSource *)&buf,(string *)&logLen);
  pPVar6 = glu::ProgramSources::operator<<((ProgramSources *)&result,(ShaderSource *)&buf);
  glu::ShaderProgram::ShaderProgram(&frgProgram,pRVar1,pPVar6);
  std::__cxx11::string::~string((string *)&buf._M_string_length);
  std::__cxx11::string::~string((string *)&logLen);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&result);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf," // ERROR: ",(allocator<char> *)&logLen);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,&buf);
  std::__cxx11::string::~string((string *)&buf);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"VtxProg",(allocator<char> *)&section_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLen,"Vertex program",(allocator<char> *)&written);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,&buf,(string *)&logLen);
  std::__cxx11::string::~string((string *)&logLen);
  std::__cxx11::string::~string((string *)&buf);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &vtxProgram);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"FrgProg",(allocator<char> *)&section_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLen,"Fragment program",(allocator<char> *)&written);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,&buf,(string *)&logLen);
  std::__cxx11::string::~string((string *)&logLen);
  std::__cxx11::string::~string((string *)&buf);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &frgProgram);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if ((vtxProgram.m_program.m_info.linkOk != true) || (frgProgram.m_program.m_info.linkOk == false))
  {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"failed to build program",(allocator<char> *)&logLen);
    tcu::TestError::TestError(this_00,&buf);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  gl.m_enableLog = true;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Initial",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLen,"Initial",(allocator<char> *)&written);
  tcu::ScopedLogSection::ScopedLogSection(&section_2,pTVar2,&buf,(string *)&logLen);
  std::__cxx11::string::~string((string *)&logLen);
  std::__cxx11::string::~string((string *)&buf);
  glu::ProgramPipeline::ProgramPipeline
            ((ProgramPipeline *)&section,((this->super_TestCase).m_context)->m_renderCtx);
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  std::__cxx11::string::_M_construct((ulong)&buf,'\x03');
  written = -1;
  deqp::gls::StateQueryUtil::verifyStatePipelineInteger
            (&result,&gl,local_2b8,0x8b84,0,QUERY_PIPELINE_INTEGER);
  glu::CallLogWrapper::glGetProgramPipelineInfoLog(&gl,local_2b8,2,&written,buf._M_dataplus._M_p);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"query log",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x152);
  if (written == 0) {
    if (*buf._M_dataplus._M_p == '\0') {
      if ((buf._M_dataplus._M_p[1] == 'X') && (buf._M_dataplus._M_p[2] == 'X')) goto LAB_012c2161;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&logLen,"buffer after returned length modified",&local_30d);
      tcu::ResultCollector::fail(&result,(string *)&logLen);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&logLen,"log was not 0-sized null-terminated string",&local_30d);
      tcu::ResultCollector::fail(&result,(string *)&logLen);
    }
  }
  else if (written == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&logLen,"\'length\' was not written to",&local_30d);
    tcu::ResultCollector::fail(&result,(string *)&logLen);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&logLen,"\'length\' was not 0",&local_30d);
    tcu::ResultCollector::fail(&result,(string *)&logLen);
  }
  std::__cxx11::string::~string((string *)&logLen);
LAB_012c2161:
  std::__cxx11::string::~string((string *)&buf);
  glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&section);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"ValidationFail",(allocator<char> *)&section_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLen,"Failed validation",(allocator<char> *)&written);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,&buf,(string *)&logLen);
  std::__cxx11::string::~string((string *)&logLen);
  std::__cxx11::string::~string((string *)&buf);
  glu::ProgramPipeline::ProgramPipeline
            ((ProgramPipeline *)&buf,((this->super_TestCase).m_context)->m_renderCtx);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&logLen);
  glu::CallLogWrapper::glBindProgramPipeline(&gl,(GLuint)buf._M_string_length);
  glu::CallLogWrapper::glUseProgramStages
            (&gl,(GLuint)buf._M_string_length,1,vtxProgram.m_program.m_program);
  glu::CallLogWrapper::glUseProgramStages
            (&gl,(GLuint)buf._M_string_length,2,frgProgram.m_program.m_program);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"gen pipeline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x166);
  glu::CallLogWrapper::glBindProgramPipeline(&gl,0);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"unbind pipeline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x169);
  glu::CallLogWrapper::glValidateProgramPipeline(&gl,(GLuint)buf._M_string_length);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"gen pipeline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x16b);
  glu::CallLogWrapper::glGetProgramPipelineiv
            (&gl,(GLuint)buf._M_string_length,0x8b84,&logLen.m_value);
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"get INFO_LOG_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x16e);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&logLen,&result);
  if (bVar3) {
    verifyInfoLogQuery((Functional *)&result,(ResultCollector *)&gl,
                       (CallLogWrapper *)(ulong)(uint)logLen.m_value,(GLuint)buf._M_string_length,
                       0x156f9a2,0,"glGetProgramPipelineInfoLog");
  }
  glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)&buf);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  glu::ShaderProgram::~ShaderProgram(&frgProgram);
  glu::ShaderProgram::~ShaderProgram(&vtxProgram);
  return STOP;
}

Assistant:

InfoLogCase::IterateResult InfoLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	static const char* const s_incompatibleFragmentSource = "#version 310 es\n"
															"in mediump vec2 v_colorB;\n"
															"in mediump vec2 v_colorC;\n"
															"layout(location=0) out highp vec4 o_color;\n"
															"void main()\n"
															"{\n"
															"	o_color = v_colorB.xxyy + v_colorC.yyxy;\n"
															"}\n";

	glu::ShaderProgram		vtxProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource));
	glu::ShaderProgram		frgProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::FragmentSource(s_incompatibleFragmentSource));
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxProg", "Vertex program");
		m_testCtx.getLog() << vtxProgram;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgProg", "Fragment program");
		m_testCtx.getLog() << frgProgram;
	}

	if (!vtxProgram.isOk() || !frgProgram.isOk())
		throw tcu::TestError("failed to build program");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Initial", "Initial");
		glu::ProgramPipeline		pipeline	(m_context.getRenderContext());
		std::string					buf			(3, 'X');
		int							written		= -1;

		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_INFO_LOG_LENGTH, 0, QUERY_PIPELINE_INTEGER);

		gl.glGetProgramPipelineInfoLog(pipeline.getPipeline(), 2, &written, &buf[0]);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query log");

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("'length' was not 0");
		else if (buf[0] != '\0')
			result.fail("log was not 0-sized null-terminated string");
		else if (buf[1] != 'X' || buf[2] != 'X')
			result.fail("buffer after returned length modified");
	}

	{
		const tcu::ScopedLogSection				superSection	(m_testCtx.getLog(), "ValidationFail", "Failed validation");
		glu::ProgramPipeline					pipeline		(m_context.getRenderContext());
		StateQueryMemoryWriteGuard<glw::GLint>	logLen;

		gl.glBindProgramPipeline(pipeline.getPipeline());
		gl.glUseProgramStages(pipeline.getPipeline(), GL_VERTEX_SHADER_BIT, vtxProgram.getProgram());
		gl.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, frgProgram.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");

		gl.glBindProgramPipeline(0);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "unbind pipeline");
		gl.glValidateProgramPipeline(pipeline.getPipeline());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");

		gl.glGetProgramPipelineiv(pipeline.getPipeline(), GL_INFO_LOG_LENGTH, &logLen);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "get INFO_LOG_LENGTH");

		if (logLen.verifyValidity(result))
			verifyInfoLogQuery(result, gl, logLen, pipeline.getPipeline(), &glu::CallLogWrapper::glGetProgramPipelineInfoLog, "glGetProgramPipelineInfoLog");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}